

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::PlainSelectTemplated<duckdb::string_t,duckdb::StringParquetValueConversion>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          Vector *result,SelectionVector *sel,idx_t approved_tuple_count)

{
  if ((defines != (uint8_t *)0x0) && (this->column_schema->max_define != 0)) {
    PlainSelectTemplatedInternal<duckdb::string_t,duckdb::StringParquetValueConversion,true,true>
              (this,plain_data,defines,num_values,result,sel,approved_tuple_count);
    return;
  }
  PlainSelectTemplatedInternal<duckdb::string_t,duckdb::StringParquetValueConversion,false,true>
            (this,plain_data,defines,num_values,result,sel,approved_tuple_count);
  return;
}

Assistant:

void PlainSelectTemplated(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, Vector &result,
	                          const SelectionVector &sel, idx_t approved_tuple_count) {
		if (HasDefines() && defines) {
			PlainSelectTemplatedInternal<VALUE_TYPE, CONVERSION, true, true>(plain_data, defines, num_values, result,
			                                                                 sel, approved_tuple_count);
		} else {
			PlainSelectTemplatedInternal<VALUE_TYPE, CONVERSION, false, true>(plain_data, defines, num_values, result,
			                                                                  sel, approved_tuple_count);
		}
	}